

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_dot_pack8.h
# Opt level: O2

void ncnn::convolution_winograd_dot_pack8_avx
               (Mat *bottom_blob_tm,int outch,Mat *kernel_tm,Mat *top_blob_tm,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint _w;
  int *piVar4;
  size_t sVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ulong uVar17;
  undefined1 (*pauVar18) [32];
  ulong uVar19;
  float *pfVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  uint _h;
  int iVar26;
  undefined1 (*pauVar27) [32];
  ulong uVar28;
  int iVar29;
  float *pfVar30;
  ulong uVar31;
  int iVar32;
  long lVar33;
  void *pvVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [32];
  undefined1 local_98 [64];
  size_t local_58;
  Mat *local_48;
  ulong local_40;
  void *local_38;
  
  _w = bottom_blob_tm->w;
  lVar38 = (long)(int)_w;
  uVar23 = bottom_blob_tm->h;
  iVar26 = bottom_blob_tm->c;
  local_58 = 0;
  local_98._0_8_ = (Allocator *)0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_98._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_98._24_4_ = 0;
  local_98._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  if (lVar38 < 0xc) {
    if ((int)_w < 8) {
      if ((int)_w < 4) {
        _h = _w;
        iVar32 = iVar26;
        if (1 < (int)_w) {
          iVar32 = iVar26 * 2;
          _h = (_w & 1) + 1;
        }
      }
      else {
        _h = (_w & 1) + 1 + (uint)((_w >> 1 & 1) != 0);
        iVar32 = iVar26 * 4;
      }
    }
    else {
      _h = (_w & 1) + 1 + (_w >> 2 & 1) + (uint)((_w >> 1 & 1) != 0);
      iVar32 = iVar26 * 8;
    }
  }
  else {
    uVar31 = (ulong)_w % 0xc;
    _h = ((uint)uVar31 & 1) + (int)(uVar31 >> 3) + _w / 0xc + ((uint)(uVar31 >> 2) & 1) +
         (uint)(((uint)uVar31 >> 1 & 1) != 0);
    iVar32 = iVar26 * 0xc;
  }
  local_98._32_8_ = local_98._0_8_;
  local_98._40_4_ = local_98._8_4_;
  local_98._44_4_ = local_98._12_4_;
  local_48 = kernel_tm;
  Mat::create((Mat *)local_98,iVar32,_h,uVar23,0x20,8,opt->workspace_allocator);
  uVar31 = 0;
  iVar32 = 0;
  if (0 < iVar26) {
    iVar32 = iVar26;
  }
  uVar17 = 0;
  if (0 < (int)uVar23) {
    uVar17 = (ulong)uVar23;
  }
  for (; uVar31 != uVar17; uVar31 = uVar31 + 1) {
    lVar35 = local_58 * uVar31 * local_98._16_8_;
    lVar33 = (long)(int)local_98._44_4_ * local_98._16_8_;
    lVar36 = uVar31 * lVar38;
    for (uVar24 = 0; (long)uVar24 < lVar38 + -0xb; uVar24 = uVar24 + 0xc) {
      pauVar18 = (undefined1 (*) [32])
                 ((long)(_func_int ***)local_98._0_8_ + (uVar24 / 0xc) * lVar33 + lVar35);
      pauVar27 = (undefined1 (*) [32])((uVar24 + lVar36) * 0x20 + (long)bottom_blob_tm->data);
      iVar29 = iVar32;
      while (bVar39 = iVar29 != 0, iVar29 = iVar29 + -1, bVar39) {
        auVar16 = vunpcklps_avx(*pauVar27,pauVar27[1]);
        auVar13 = vunpckhps_avx(*pauVar27,pauVar27[1]);
        auVar62 = vunpcklps_avx(pauVar27[2],pauVar27[3]);
        auVar50 = vunpckhps_avx(pauVar27[2],pauVar27[3]);
        auVar71 = vunpcklps_avx(pauVar27[4],pauVar27[5]);
        auVar48 = vunpckhps_avx(pauVar27[4],pauVar27[5]);
        auVar57 = vunpcklps_avx(pauVar27[6],pauVar27[7]);
        auVar14 = vunpckhps_avx(pauVar27[6],pauVar27[7]);
        auVar63 = vunpcklps_avx(pauVar27[8],pauVar27[9]);
        auVar54 = vunpckhps_avx(pauVar27[8],pauVar27[9]);
        auVar65 = vunpcklps_avx(pauVar27[10],pauVar27[0xb]);
        auVar15 = vunpckhps_avx(pauVar27[10],pauVar27[0xb]);
        auVar56 = vunpcklpd_avx(auVar16,auVar62);
        auVar16 = vunpckhpd_avx(auVar16,auVar62);
        auVar62 = vunpcklpd_avx(auVar13,auVar50);
        auVar13 = vunpckhpd_avx(auVar13,auVar50);
        auVar59 = vunpcklpd_avx(auVar71,auVar57);
        auVar50 = vunpckhpd_avx(auVar71,auVar57);
        auVar71 = vunpcklpd_avx(auVar48,auVar14);
        auVar48 = vunpckhpd_avx(auVar48,auVar14);
        auVar57 = vunpcklpd_avx(auVar63,auVar65);
        auVar14 = vunpckhpd_avx(auVar63,auVar65);
        auVar63 = vunpcklpd_avx(auVar54,auVar15);
        auVar54 = vunpckhpd_avx(auVar54,auVar15);
        auVar65._16_16_ = auVar59._0_16_;
        auVar65._0_16_ = auVar56._0_16_;
        auVar15 = vperm2f128_avx(auVar56,auVar59,0x31);
        auVar68._16_16_ = auVar16._0_16_;
        auVar68._0_16_ = auVar57._0_16_;
        auVar16 = vperm2f128_avx(auVar57,auVar16,0x31);
        auVar56._16_16_ = auVar14._0_16_;
        auVar56._0_16_ = auVar50._0_16_;
        auVar50 = vperm2f128_avx(auVar50,auVar14,0x31);
        auVar59._16_16_ = auVar71._0_16_;
        auVar59._0_16_ = auVar62._0_16_;
        auVar14 = vperm2f128_avx(auVar62,auVar71,0x31);
        auVar71._16_16_ = auVar13._0_16_;
        auVar71._0_16_ = auVar63._0_16_;
        auVar13 = vperm2f128_avx(auVar63,auVar13,0x31);
        auVar62._16_16_ = auVar54._0_16_;
        auVar62._0_16_ = auVar48._0_16_;
        auVar48 = vperm2f128_avx(auVar48,auVar54,0x31);
        *pauVar18 = auVar65;
        pauVar18[1] = auVar68;
        pauVar18[2] = auVar56;
        pauVar18[3] = auVar59;
        pauVar18[4] = auVar71;
        pauVar18[5] = auVar62;
        pauVar18[6] = auVar15;
        pauVar18[7] = auVar16;
        pauVar18[8] = auVar50;
        pauVar18[9] = auVar14;
        pauVar18[10] = auVar13;
        pauVar18[0xb] = auVar48;
        pauVar18 = pauVar18 + 0xc;
        pauVar27 = pauVar27 + bottom_blob_tm->cstep;
      }
    }
    for (; (long)uVar24 < lVar38 + -7; uVar24 = uVar24 + 8) {
      pauVar27 = (undefined1 (*) [32])
                 ((long)(_func_int ***)local_98._0_8_ +
                 (ulong)(uint)((int)((uVar24 & 0xffffffff) % 0xc >> 3) +
                              (int)((uVar24 & 0xffffffff) / 0xc)) * lVar33 + lVar35);
      pauVar18 = (undefined1 (*) [32])((uVar24 + lVar36) * 0x20 + (long)bottom_blob_tm->data);
      iVar29 = iVar32;
      while (bVar39 = iVar29 != 0, iVar29 = iVar29 + -1, bVar39) {
        auVar16 = vunpcklps_avx(*pauVar18,pauVar18[1]);
        auVar13 = vunpckhps_avx(*pauVar18,pauVar18[1]);
        auVar15 = vunpcklps_avx(pauVar18[2],pauVar18[3]);
        auVar50 = vunpckhps_avx(pauVar18[2],pauVar18[3]);
        auVar62 = vunpcklps_avx(pauVar18[4],pauVar18[5]);
        auVar48 = vunpckhps_avx(pauVar18[4],pauVar18[5]);
        auVar59 = vunpcklps_avx(pauVar18[6],pauVar18[7]);
        auVar14 = vunpckhps_avx(pauVar18[6],pauVar18[7]);
        auVar54 = vunpcklpd_avx(auVar16,auVar15);
        auVar16 = vunpckhpd_avx(auVar16,auVar15);
        auVar15 = vunpcklpd_avx(auVar13,auVar50);
        auVar13 = vunpckhpd_avx(auVar13,auVar50);
        auVar56 = vunpcklpd_avx(auVar62,auVar59);
        auVar50 = vunpckhpd_avx(auVar62,auVar59);
        auVar62 = vunpcklpd_avx(auVar48,auVar14);
        auVar48 = vunpckhpd_avx(auVar48,auVar14);
        auVar57._16_16_ = auVar56._0_16_;
        auVar57._0_16_ = auVar54._0_16_;
        auVar63._16_16_ = auVar50._0_16_;
        auVar63._0_16_ = auVar16._0_16_;
        auVar66._16_16_ = auVar62._0_16_;
        auVar66._0_16_ = auVar15._0_16_;
        auVar69._16_16_ = auVar48._0_16_;
        auVar69._0_16_ = auVar13._0_16_;
        auVar14 = vperm2f128_avx(auVar54,auVar56,0x31);
        auVar16 = vperm2f128_avx(auVar16,auVar50,0x31);
        auVar50 = vperm2f128_avx(auVar15,auVar62,0x31);
        auVar13 = vperm2f128_avx(auVar13,auVar48,0x31);
        *pauVar27 = auVar57;
        pauVar27[1] = auVar63;
        pauVar27[2] = auVar66;
        pauVar27[3] = auVar69;
        pauVar27[4] = auVar14;
        pauVar27[5] = auVar16;
        pauVar27[6] = auVar50;
        pauVar27[7] = auVar13;
        pauVar27 = pauVar27 + 8;
        pauVar18 = pauVar18 + bottom_blob_tm->cstep;
      }
    }
    for (; (long)(uVar24 | 3) < lVar38; uVar24 = uVar24 + 4) {
      uVar19 = (uVar24 & 0xffffffff) % 0xc;
      pauVar27 = (undefined1 (*) [32])
                 ((long)(_func_int ***)local_98._0_8_ +
                 (ulong)((int)(uVar19 >> 3) + (int)((uVar24 & 0xffffffff) / 0xc) +
                        (uint)(((uint)uVar19 >> 2 & 1) != 0)) * lVar33 + lVar35);
      pauVar18 = (undefined1 (*) [32])((uVar24 + lVar36) * 0x20 + (long)bottom_blob_tm->data);
      iVar29 = iVar32;
      while (bVar39 = iVar29 != 0, iVar29 = iVar29 + -1, bVar39) {
        auVar16 = vunpcklps_avx(*pauVar18,pauVar18[1]);
        auVar13 = vunpckhps_avx(*pauVar18,pauVar18[1]);
        auVar14 = vunpcklps_avx(pauVar18[2],pauVar18[3]);
        auVar50 = vunpckhps_avx(pauVar18[2],pauVar18[3]);
        auVar48 = vunpcklpd_avx(auVar16,auVar14);
        auVar16 = vunpckhpd_avx(auVar16,auVar14);
        auVar14 = vunpcklpd_avx(auVar13,auVar50);
        auVar13 = vunpckhpd_avx(auVar13,auVar50);
        auVar50._16_16_ = auVar16._0_16_;
        auVar50._0_16_ = auVar48._0_16_;
        auVar54._16_16_ = auVar13._0_16_;
        auVar54._0_16_ = auVar14._0_16_;
        auVar16 = vperm2f128_avx(auVar48,auVar16,0x31);
        auVar13 = vperm2f128_avx(auVar14,auVar13,0x31);
        *pauVar27 = auVar50;
        pauVar27[1] = auVar54;
        pauVar27[2] = auVar16;
        pauVar27[3] = auVar13;
        pauVar27 = pauVar27 + 4;
        pauVar18 = pauVar18 + bottom_blob_tm->cstep;
      }
    }
    for (; (long)(uVar24 | 1) < lVar38; uVar24 = uVar24 + 2) {
      uVar19 = (uVar24 & 0xffffffff) % 0xc;
      pauVar18 = (undefined1 (*) [32])
                 ((long)(_func_int ***)local_98._0_8_ +
                 (ulong)(((uint)(uVar19 >> 2) & 1) +
                         (int)(uVar19 >> 3) + (int)((uVar24 & 0xffffffff) / 0xc) +
                        (uint)(((uint)uVar19 >> 1 & 1) != 0)) * lVar33 + lVar35);
      pauVar27 = (undefined1 (*) [32])((uVar24 + lVar36) * 0x20 + (long)bottom_blob_tm->data);
      iVar29 = iVar32;
      while (bVar39 = iVar29 != 0, iVar29 = iVar29 + -1, bVar39) {
        auVar13 = vunpcklps_avx(*pauVar27,pauVar27[1]);
        auVar16 = vunpckhps_avx(*pauVar27,pauVar27[1]);
        auVar48._16_16_ = auVar16._0_16_;
        auVar48._0_16_ = auVar13._0_16_;
        auVar16 = vperm2f128_avx(auVar13,auVar16,0x31);
        *pauVar18 = auVar48;
        pauVar18[1] = auVar16;
        pauVar18 = pauVar18 + 2;
        pauVar27 = pauVar27 + bottom_blob_tm->cstep;
      }
    }
    for (; (long)uVar24 < lVar38; uVar24 = uVar24 + 1) {
      uVar19 = (uVar24 & 0xffffffff) % 0xc;
      pauVar27 = (undefined1 (*) [32])
                 ((long)(_func_int ***)local_98._0_8_ +
                 (ulong)(((uint)uVar19 & 1) + (int)(uVar19 >> 3) +
                         (int)((uVar24 & 0xffffffff) / 0xc) + ((uint)(uVar19 >> 2) & 1) +
                        (uint)(((uint)uVar19 >> 1 & 1) != 0)) * lVar33 + lVar35);
      pauVar18 = (undefined1 (*) [32])((uVar24 + lVar36) * 0x20 + (long)bottom_blob_tm->data);
      iVar29 = iVar32;
      while (bVar39 = iVar29 != 0, iVar29 = iVar29 + -1, bVar39) {
        *pauVar27 = *pauVar18;
        pauVar27 = pauVar27 + 1;
        pauVar18 = pauVar18 + bottom_blob_tm->cstep;
      }
    }
  }
  piVar4 = bottom_blob_tm->refcount;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (bottom_blob_tm->allocator == (Allocator *)0x0) {
        free(bottom_blob_tm->data);
      }
      else {
        (*bottom_blob_tm->allocator->_vptr_Allocator[3])();
      }
    }
  }
  bottom_blob_tm->cstep = 0;
  *(undefined4 *)&bottom_blob_tm->data = 0;
  *(undefined4 *)((long)&bottom_blob_tm->data + 4) = 0;
  *(undefined4 *)&bottom_blob_tm->refcount = 0;
  *(undefined4 *)((long)&bottom_blob_tm->refcount + 4) = 0;
  *(undefined4 *)((long)&bottom_blob_tm->refcount + 4) = 0;
  *(undefined4 *)&bottom_blob_tm->elemsize = 0;
  *(undefined4 *)((long)&bottom_blob_tm->elemsize + 4) = 0;
  bottom_blob_tm->elempack = 0;
  *(undefined4 *)&bottom_blob_tm->allocator = 0;
  *(undefined4 *)((long)&bottom_blob_tm->allocator + 4) = 0;
  bottom_blob_tm->dims = 0;
  bottom_blob_tm->w = 0;
  bottom_blob_tm->w = 0;
  bottom_blob_tm->h = 0;
  bottom_blob_tm->d = 0;
  bottom_blob_tm->c = 0;
  Mat::create(top_blob_tm,_w,uVar23,outch,0x20,8,opt->workspace_allocator);
  uVar31 = 0;
  uVar24 = (ulong)(uint)(iVar26 << 3);
  if (iVar26 << 3 < 1) {
    uVar24 = uVar31;
  }
  uVar19 = (ulong)(uint)outch;
  if (outch < 1) {
    uVar19 = uVar31;
  }
  while (uVar28 = uVar31, uVar28 != uVar19) {
    pauVar18 = (undefined1 (*) [32])
               (top_blob_tm->cstep * uVar28 * top_blob_tm->elemsize + (long)top_blob_tm->data);
    sVar5 = local_48->elemsize;
    local_38 = (void *)(local_48->cstep * uVar28 * sVar5 + (long)local_48->data);
    lVar33 = (long)local_48->w * sVar5;
    pvVar34 = (void *)(local_48->cstep * sVar5 * uVar28 + (long)local_48->data);
    for (uVar31 = 0; uVar31 != uVar17; uVar31 = uVar31 + 1) {
      lVar36 = (long)(int)local_98._44_4_;
      lVar35 = local_58 * uVar31;
      for (uVar25 = 0; (long)uVar25 < lVar38 + -0xb; uVar25 = uVar25 + 0xc) {
        pfVar20 = (float *)((long)(_func_int ***)local_98._0_8_ +
                           (uVar25 / 0xc) * local_98._16_8_ * lVar36 + lVar35 * local_98._16_8_);
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar60 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar61 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar67 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar70 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar22 = uVar24;
        pfVar30 = (float *)(lVar33 * uVar31 + (long)local_38);
        while( true ) {
          iVar26 = (int)uVar22;
          uVar22 = (ulong)(iVar26 - 1);
          if (iVar26 == 0) break;
          fVar3 = *pfVar30;
          fVar6 = pfVar30[1];
          fVar7 = pfVar30[2];
          fVar8 = pfVar30[3];
          fVar9 = pfVar30[4];
          fVar10 = pfVar30[5];
          fVar11 = pfVar30[6];
          fVar1 = *pfVar20;
          fVar2 = pfVar20[1];
          auVar70 = ZEXT3264(CONCAT428(fVar1 + auVar70._28_4_,
                                       CONCAT424(fVar1 * fVar11 + auVar70._24_4_,
                                                 CONCAT420(fVar1 * fVar10 + auVar70._20_4_,
                                                           CONCAT416(fVar1 * fVar9 + auVar70._16_4_,
                                                                     CONCAT412(fVar1 * fVar8 +
                                                                               auVar70._12_4_,
                                                                               CONCAT48(fVar1 * 
                                                  fVar7 + auVar70._8_4_,
                                                  CONCAT44(fVar1 * fVar6 + auVar70._4_4_,
                                                           fVar1 * fVar3 + auVar70._0_4_))))))));
          auVar67 = ZEXT3264(CONCAT428(fVar1 + auVar67._28_4_,
                                       CONCAT424(fVar2 * fVar11 + auVar67._24_4_,
                                                 CONCAT420(fVar2 * fVar10 + auVar67._20_4_,
                                                           CONCAT416(fVar2 * fVar9 + auVar67._16_4_,
                                                                     CONCAT412(fVar2 * fVar8 +
                                                                               auVar67._12_4_,
                                                                               CONCAT48(fVar2 * 
                                                  fVar7 + auVar67._8_4_,
                                                  CONCAT44(fVar2 * fVar6 + auVar67._4_4_,
                                                           fVar2 * fVar3 + auVar67._0_4_))))))));
          fVar1 = pfVar20[2];
          fVar2 = pfVar20[3];
          auVar64 = ZEXT3264(CONCAT428(fVar1 + auVar64._28_4_,
                                       CONCAT424(fVar1 * fVar11 + auVar64._24_4_,
                                                 CONCAT420(fVar1 * fVar10 + auVar64._20_4_,
                                                           CONCAT416(fVar1 * fVar9 + auVar64._16_4_,
                                                                     CONCAT412(fVar1 * fVar8 +
                                                                               auVar64._12_4_,
                                                                               CONCAT48(fVar1 * 
                                                  fVar7 + auVar64._8_4_,
                                                  CONCAT44(fVar1 * fVar6 + auVar64._4_4_,
                                                           fVar1 * fVar3 + auVar64._0_4_))))))));
          auVar61 = ZEXT3264(CONCAT428(fVar1 + auVar61._28_4_,
                                       CONCAT424(fVar2 * fVar11 + auVar61._24_4_,
                                                 CONCAT420(fVar2 * fVar10 + auVar61._20_4_,
                                                           CONCAT416(fVar2 * fVar9 + auVar61._16_4_,
                                                                     CONCAT412(fVar2 * fVar8 +
                                                                               auVar61._12_4_,
                                                                               CONCAT48(fVar2 * 
                                                  fVar7 + auVar61._8_4_,
                                                  CONCAT44(fVar2 * fVar6 + auVar61._4_4_,
                                                           fVar2 * fVar3 + auVar61._0_4_))))))));
          fVar1 = pfVar20[4];
          fVar2 = pfVar20[5];
          auVar60 = ZEXT3264(CONCAT428(fVar1 + auVar60._28_4_,
                                       CONCAT424(fVar1 * fVar11 + auVar60._24_4_,
                                                 CONCAT420(fVar1 * fVar10 + auVar60._20_4_,
                                                           CONCAT416(fVar1 * fVar9 + auVar60._16_4_,
                                                                     CONCAT412(fVar1 * fVar8 +
                                                                               auVar60._12_4_,
                                                                               CONCAT48(fVar1 * 
                                                  fVar7 + auVar60._8_4_,
                                                  CONCAT44(fVar1 * fVar6 + auVar60._4_4_,
                                                           fVar1 * fVar3 + auVar60._0_4_))))))));
          auVar58 = ZEXT3264(CONCAT428(fVar1 + auVar58._28_4_,
                                       CONCAT424(fVar2 * fVar11 + auVar58._24_4_,
                                                 CONCAT420(fVar2 * fVar10 + auVar58._20_4_,
                                                           CONCAT416(fVar2 * fVar9 + auVar58._16_4_,
                                                                     CONCAT412(fVar2 * fVar8 +
                                                                               auVar58._12_4_,
                                                                               CONCAT48(fVar2 * 
                                                  fVar7 + auVar58._8_4_,
                                                  CONCAT44(fVar2 * fVar6 + auVar58._4_4_,
                                                           fVar2 * fVar3 + auVar58._0_4_))))))));
          fVar1 = pfVar20[6];
          fVar2 = pfVar20[7];
          auVar55 = ZEXT3264(CONCAT428(fVar1 + auVar55._28_4_,
                                       CONCAT424(fVar1 * fVar11 + auVar55._24_4_,
                                                 CONCAT420(fVar1 * fVar10 + auVar55._20_4_,
                                                           CONCAT416(fVar1 * fVar9 + auVar55._16_4_,
                                                                     CONCAT412(fVar1 * fVar8 +
                                                                               auVar55._12_4_,
                                                                               CONCAT48(fVar1 * 
                                                  fVar7 + auVar55._8_4_,
                                                  CONCAT44(fVar1 * fVar6 + auVar55._4_4_,
                                                           fVar1 * fVar3 + auVar55._0_4_))))))));
          auVar53 = ZEXT3264(CONCAT428(fVar1 + auVar53._28_4_,
                                       CONCAT424(fVar2 * fVar11 + auVar53._24_4_,
                                                 CONCAT420(fVar2 * fVar10 + auVar53._20_4_,
                                                           CONCAT416(fVar2 * fVar9 + auVar53._16_4_,
                                                                     CONCAT412(fVar2 * fVar8 +
                                                                               auVar53._12_4_,
                                                                               CONCAT48(fVar2 * 
                                                  fVar7 + auVar53._8_4_,
                                                  CONCAT44(fVar2 * fVar6 + auVar53._4_4_,
                                                           fVar2 * fVar3 + auVar53._0_4_))))))));
          fVar1 = pfVar20[8];
          fVar2 = pfVar20[9];
          auVar52 = ZEXT3264(CONCAT428(fVar1 + auVar52._28_4_,
                                       CONCAT424(fVar1 * fVar11 + auVar52._24_4_,
                                                 CONCAT420(fVar1 * fVar10 + auVar52._20_4_,
                                                           CONCAT416(fVar1 * fVar9 + auVar52._16_4_,
                                                                     CONCAT412(fVar1 * fVar8 +
                                                                               auVar52._12_4_,
                                                                               CONCAT48(fVar1 * 
                                                  fVar7 + auVar52._8_4_,
                                                  CONCAT44(fVar1 * fVar6 + auVar52._4_4_,
                                                           fVar1 * fVar3 + auVar52._0_4_))))))));
          auVar51 = ZEXT3264(CONCAT428(fVar1 + auVar51._28_4_,
                                       CONCAT424(fVar2 * fVar11 + auVar51._24_4_,
                                                 CONCAT420(fVar2 * fVar10 + auVar51._20_4_,
                                                           CONCAT416(fVar2 * fVar9 + auVar51._16_4_,
                                                                     CONCAT412(fVar2 * fVar8 +
                                                                               auVar51._12_4_,
                                                                               CONCAT48(fVar2 * 
                                                  fVar7 + auVar51._8_4_,
                                                  CONCAT44(fVar2 * fVar6 + auVar51._4_4_,
                                                           fVar2 * fVar3 + auVar51._0_4_))))))));
          fVar1 = pfVar20[10];
          fVar2 = pfVar20[0xb];
          fVar40 = fVar1 * fVar3 + fVar40;
          fVar41 = fVar1 * fVar6 + fVar41;
          fVar42 = fVar1 * fVar7 + fVar42;
          fVar43 = fVar1 * fVar8 + fVar43;
          fVar44 = fVar1 * fVar9 + fVar44;
          fVar45 = fVar1 * fVar10 + fVar45;
          fVar46 = fVar1 * fVar11 + fVar46;
          fVar47 = fVar1 + fVar47;
          auVar49 = ZEXT3264(CONCAT428(pfVar30[7] + auVar49._28_4_,
                                       CONCAT424(fVar2 * fVar11 + auVar49._24_4_,
                                                 CONCAT420(fVar2 * fVar10 + auVar49._20_4_,
                                                           CONCAT416(fVar2 * fVar9 + auVar49._16_4_,
                                                                     CONCAT412(fVar2 * fVar8 +
                                                                               auVar49._12_4_,
                                                                               CONCAT48(fVar2 * 
                                                  fVar7 + auVar49._8_4_,
                                                  CONCAT44(fVar2 * fVar6 + auVar49._4_4_,
                                                           fVar2 * fVar3 + auVar49._0_4_))))))));
          pfVar20 = pfVar20 + 0xc;
          pfVar30 = pfVar30 + 8;
        }
        *pauVar18 = auVar70._0_32_;
        pauVar18[1] = auVar67._0_32_;
        pauVar18[2] = auVar64._0_32_;
        pauVar18[3] = auVar61._0_32_;
        pauVar18[4] = auVar60._0_32_;
        pauVar18[5] = auVar58._0_32_;
        pauVar18[6] = auVar55._0_32_;
        pauVar18[7] = auVar53._0_32_;
        pauVar18[8] = auVar52._0_32_;
        pauVar18[9] = auVar51._0_32_;
        *(float *)pauVar18[10] = fVar40;
        *(float *)(pauVar18[10] + 4) = fVar41;
        *(float *)(pauVar18[10] + 8) = fVar42;
        *(float *)(pauVar18[10] + 0xc) = fVar43;
        *(float *)(pauVar18[10] + 0x10) = fVar44;
        *(float *)(pauVar18[10] + 0x14) = fVar45;
        *(float *)(pauVar18[10] + 0x18) = fVar46;
        *(float *)(pauVar18[10] + 0x1c) = fVar47;
        pauVar18[0xb] = auVar49._0_32_;
        pauVar18 = pauVar18 + 0xc;
      }
      while( true ) {
        if ((int)_w <= (int)uVar25 + 7) break;
        lVar21 = ((ulong)(uint)((int)((uVar25 & 0xffffffff) / 0xc) +
                               (int)((uVar25 & 0xffffffff) % 0xc >> 3)) * lVar36 + lVar35) *
                 local_98._16_8_;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        lVar37 = 0;
        auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar53 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar55 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar58 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar60 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar22 = uVar24;
        while( true ) {
          iVar26 = (int)uVar22;
          uVar22 = (ulong)(iVar26 - 1);
          if (iVar26 == 0) break;
          fVar1 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar37 + lVar21);
          auVar16 = *(undefined1 (*) [32])((long)pvVar34 + lVar37);
          fVar2 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar37 + lVar21 + 4);
          fVar6 = auVar16._0_4_;
          fVar7 = auVar16._4_4_;
          fVar8 = auVar16._8_4_;
          fVar9 = auVar16._12_4_;
          fVar10 = auVar16._16_4_;
          fVar11 = auVar16._20_4_;
          fVar12 = auVar16._24_4_;
          fVar40 = fVar1 * fVar6 + fVar40;
          fVar41 = fVar1 * fVar7 + fVar41;
          fVar42 = fVar1 * fVar8 + fVar42;
          fVar43 = fVar1 * fVar9 + fVar43;
          fVar44 = fVar1 * fVar10 + fVar44;
          fVar45 = fVar1 * fVar11 + fVar45;
          fVar46 = fVar1 * fVar12 + fVar46;
          fVar47 = fVar1 + fVar47;
          fVar3 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 8))->_vptr_Allocator +
                            lVar37 + lVar21);
          auVar49 = ZEXT3264(CONCAT428(fVar1 + auVar49._28_4_,
                                       CONCAT424(fVar2 * fVar12 + auVar49._24_4_,
                                                 CONCAT420(fVar2 * fVar11 + auVar49._20_4_,
                                                           CONCAT416(fVar2 * fVar10 + auVar49._16_4_
                                                                     ,CONCAT412(fVar2 * fVar9 +
                                                                                auVar49._12_4_,
                                                                                CONCAT48(fVar2 * 
                                                  fVar8 + auVar49._8_4_,
                                                  CONCAT44(fVar2 * fVar7 + auVar49._4_4_,
                                                           fVar2 * fVar6 + auVar49._0_4_))))))));
          fVar1 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 8))->_vptr_Allocator +
                            lVar37 + lVar21 + 4);
          auVar51 = ZEXT3264(CONCAT428(fVar3 + auVar51._28_4_,
                                       CONCAT424(fVar3 * fVar12 + auVar51._24_4_,
                                                 CONCAT420(fVar3 * fVar11 + auVar51._20_4_,
                                                           CONCAT416(fVar3 * fVar10 + auVar51._16_4_
                                                                     ,CONCAT412(fVar3 * fVar9 +
                                                                                auVar51._12_4_,
                                                                                CONCAT48(fVar3 * 
                                                  fVar8 + auVar51._8_4_,
                                                  CONCAT44(fVar3 * fVar7 + auVar51._4_4_,
                                                           fVar3 * fVar6 + auVar51._0_4_))))))));
          fVar2 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 0x10))->_vptr_Allocator +
                            lVar37 + lVar21);
          auVar52 = ZEXT3264(CONCAT428(fVar1 + auVar52._28_4_,
                                       CONCAT424(fVar1 * fVar12 + auVar52._24_4_,
                                                 CONCAT420(fVar1 * fVar11 + auVar52._20_4_,
                                                           CONCAT416(fVar1 * fVar10 + auVar52._16_4_
                                                                     ,CONCAT412(fVar1 * fVar9 +
                                                                                auVar52._12_4_,
                                                                                CONCAT48(fVar1 * 
                                                  fVar8 + auVar52._8_4_,
                                                  CONCAT44(fVar1 * fVar7 + auVar52._4_4_,
                                                           fVar1 * fVar6 + auVar52._0_4_))))))));
          fVar1 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 0x10))->_vptr_Allocator +
                            lVar37 + lVar21 + 4);
          auVar53 = ZEXT3264(CONCAT428(fVar2 + auVar53._28_4_,
                                       CONCAT424(fVar2 * fVar12 + auVar53._24_4_,
                                                 CONCAT420(fVar2 * fVar11 + auVar53._20_4_,
                                                           CONCAT416(fVar2 * fVar10 + auVar53._16_4_
                                                                     ,CONCAT412(fVar2 * fVar9 +
                                                                                auVar53._12_4_,
                                                                                CONCAT48(fVar2 * 
                                                  fVar8 + auVar53._8_4_,
                                                  CONCAT44(fVar2 * fVar7 + auVar53._4_4_,
                                                           fVar2 * fVar6 + auVar53._0_4_))))))));
          fVar2 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 0x18))->_vptr_Allocator +
                            lVar37 + lVar21);
          auVar55 = ZEXT3264(CONCAT428(fVar1 + auVar55._28_4_,
                                       CONCAT424(fVar1 * fVar12 + auVar55._24_4_,
                                                 CONCAT420(fVar1 * fVar11 + auVar55._20_4_,
                                                           CONCAT416(fVar1 * fVar10 + auVar55._16_4_
                                                                     ,CONCAT412(fVar1 * fVar9 +
                                                                                auVar55._12_4_,
                                                                                CONCAT48(fVar1 * 
                                                  fVar8 + auVar55._8_4_,
                                                  CONCAT44(fVar1 * fVar7 + auVar55._4_4_,
                                                           fVar1 * fVar6 + auVar55._0_4_))))))));
          fVar1 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 0x18))->_vptr_Allocator +
                            lVar37 + lVar21 + 4);
          auVar58 = ZEXT3264(CONCAT428(fVar2 + auVar58._28_4_,
                                       CONCAT424(fVar2 * fVar12 + auVar58._24_4_,
                                                 CONCAT420(fVar2 * fVar11 + auVar58._20_4_,
                                                           CONCAT416(fVar2 * fVar10 + auVar58._16_4_
                                                                     ,CONCAT412(fVar2 * fVar9 +
                                                                                auVar58._12_4_,
                                                                                CONCAT48(fVar2 * 
                                                  fVar8 + auVar58._8_4_,
                                                  CONCAT44(fVar2 * fVar7 + auVar58._4_4_,
                                                           fVar2 * fVar6 + auVar58._0_4_))))))));
          auVar60 = ZEXT3264(CONCAT428(fVar1 + auVar60._28_4_,
                                       CONCAT424(fVar1 * fVar12 + auVar60._24_4_,
                                                 CONCAT420(fVar1 * fVar11 + auVar60._20_4_,
                                                           CONCAT416(fVar1 * fVar10 + auVar60._16_4_
                                                                     ,CONCAT412(fVar1 * fVar9 +
                                                                                auVar60._12_4_,
                                                                                CONCAT48(fVar1 * 
                                                  fVar8 + auVar60._8_4_,
                                                  CONCAT44(fVar1 * fVar7 + auVar60._4_4_,
                                                           fVar1 * fVar6 + auVar60._0_4_))))))));
          lVar37 = lVar37 + 0x20;
        }
        *(float *)*pauVar18 = fVar40;
        *(float *)((long)*pauVar18 + 4) = fVar41;
        *(float *)((long)*pauVar18 + 8) = fVar42;
        *(float *)((long)*pauVar18 + 0xc) = fVar43;
        *(float *)((long)*pauVar18 + 0x10) = fVar44;
        *(float *)((long)*pauVar18 + 0x14) = fVar45;
        *(float *)((long)*pauVar18 + 0x18) = fVar46;
        *(float *)((long)*pauVar18 + 0x1c) = fVar47;
        pauVar18[1] = auVar49._0_32_;
        pauVar18[2] = auVar51._0_32_;
        pauVar18[3] = auVar52._0_32_;
        pauVar18[4] = auVar53._0_32_;
        pauVar18[5] = auVar55._0_32_;
        pauVar18[6] = auVar58._0_32_;
        pauVar18[7] = auVar60._0_32_;
        pauVar18 = pauVar18 + 8;
        uVar25 = (ulong)((int)uVar25 + 8);
      }
      while( true ) {
        uVar22 = (uVar25 & 0xffffffff) % 0xc;
        if ((int)_w <= (int)((uint)uVar25 | 3)) break;
        lVar37 = ((ulong)((int)(uVar22 >> 3) + (int)((uVar25 & 0xffffffff) / 0xc) +
                         (uint)(((uint)uVar22 >> 2 & 1) != 0)) * lVar36 + lVar35) * local_98._16_8_;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        lVar21 = 0;
        auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar51 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar22 = uVar24;
        while( true ) {
          iVar26 = (int)uVar22;
          uVar22 = (ulong)(iVar26 - 1);
          if (iVar26 == 0) break;
          fVar1 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar21 + lVar37);
          auVar16 = *(undefined1 (*) [32])((long)pvVar34 + lVar21 * 2);
          fVar2 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar21 + lVar37 + 4);
          fVar6 = auVar16._0_4_;
          fVar7 = auVar16._4_4_;
          fVar8 = auVar16._8_4_;
          fVar9 = auVar16._12_4_;
          fVar10 = auVar16._16_4_;
          fVar11 = auVar16._20_4_;
          fVar12 = auVar16._24_4_;
          fVar40 = fVar1 * fVar6 + fVar40;
          fVar41 = fVar1 * fVar7 + fVar41;
          fVar42 = fVar1 * fVar8 + fVar42;
          fVar43 = fVar1 * fVar9 + fVar43;
          fVar44 = fVar1 * fVar10 + fVar44;
          fVar45 = fVar1 * fVar11 + fVar45;
          fVar46 = fVar1 * fVar12 + fVar46;
          fVar47 = fVar1 + fVar47;
          fVar3 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 8))->_vptr_Allocator +
                            lVar21 + lVar37);
          auVar49 = ZEXT3264(CONCAT428(fVar1 + auVar49._28_4_,
                                       CONCAT424(fVar2 * fVar12 + auVar49._24_4_,
                                                 CONCAT420(fVar2 * fVar11 + auVar49._20_4_,
                                                           CONCAT416(fVar2 * fVar10 + auVar49._16_4_
                                                                     ,CONCAT412(fVar2 * fVar9 +
                                                                                auVar49._12_4_,
                                                                                CONCAT48(fVar2 * 
                                                  fVar8 + auVar49._8_4_,
                                                  CONCAT44(fVar2 * fVar7 + auVar49._4_4_,
                                                           fVar2 * fVar6 + auVar49._0_4_))))))));
          fVar1 = *(float *)((long)&((Allocator *)(local_98._0_8_ + 8))->_vptr_Allocator +
                            lVar21 + lVar37 + 4);
          auVar51 = ZEXT3264(CONCAT428(fVar3 + auVar51._28_4_,
                                       CONCAT424(fVar3 * fVar12 + auVar51._24_4_,
                                                 CONCAT420(fVar3 * fVar11 + auVar51._20_4_,
                                                           CONCAT416(fVar3 * fVar10 + auVar51._16_4_
                                                                     ,CONCAT412(fVar3 * fVar9 +
                                                                                auVar51._12_4_,
                                                                                CONCAT48(fVar3 * 
                                                  fVar8 + auVar51._8_4_,
                                                  CONCAT44(fVar3 * fVar7 + auVar51._4_4_,
                                                           fVar3 * fVar6 + auVar51._0_4_))))))));
          auVar52 = ZEXT3264(CONCAT428(fVar1 + auVar52._28_4_,
                                       CONCAT424(fVar1 * fVar12 + auVar52._24_4_,
                                                 CONCAT420(fVar1 * fVar11 + auVar52._20_4_,
                                                           CONCAT416(fVar1 * fVar10 + auVar52._16_4_
                                                                     ,CONCAT412(fVar1 * fVar9 +
                                                                                auVar52._12_4_,
                                                                                CONCAT48(fVar1 * 
                                                  fVar8 + auVar52._8_4_,
                                                  CONCAT44(fVar1 * fVar7 + auVar52._4_4_,
                                                           fVar1 * fVar6 + auVar52._0_4_))))))));
          lVar21 = lVar21 + 0x10;
        }
        *(float *)*pauVar18 = fVar40;
        *(float *)((long)*pauVar18 + 4) = fVar41;
        *(float *)((long)*pauVar18 + 8) = fVar42;
        *(float *)((long)*pauVar18 + 0xc) = fVar43;
        *(float *)((long)*pauVar18 + 0x10) = fVar44;
        *(float *)((long)*pauVar18 + 0x14) = fVar45;
        *(float *)((long)*pauVar18 + 0x18) = fVar46;
        *(float *)((long)*pauVar18 + 0x1c) = fVar47;
        pauVar18[1] = auVar49._0_32_;
        pauVar18[2] = auVar51._0_32_;
        pauVar18[3] = auVar52._0_32_;
        pauVar18 = pauVar18 + 4;
        uVar25 = (ulong)((uint)uVar25 + 4);
      }
      while( true ) {
        uVar22 = (uVar25 & 0xffffffff) % 0xc;
        if ((int)_w <= (int)((uint)uVar25 | 1)) break;
        lVar21 = ((ulong)(((uint)(uVar22 >> 2) & 1) +
                          (int)(uVar22 >> 3) + (int)((uVar25 & 0xffffffff) / 0xc) +
                         (uint)(((uint)uVar22 >> 1 & 1) != 0)) * lVar36 + lVar35) * local_98._16_8_;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        lVar37 = 0;
        auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar22 = uVar24;
        while( true ) {
          iVar26 = (int)uVar22;
          uVar22 = (ulong)(iVar26 - 1);
          if (iVar26 == 0) break;
          fVar1 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar37 + lVar21);
          auVar16 = *(undefined1 (*) [32])((long)pvVar34 + lVar37 * 4);
          fVar2 = *(float *)((long)(_func_int ***)local_98._0_8_ + lVar37 + lVar21 + 4);
          fVar40 = fVar1 * auVar16._0_4_ + fVar40;
          fVar41 = fVar1 * auVar16._4_4_ + fVar41;
          fVar42 = fVar1 * auVar16._8_4_ + fVar42;
          fVar43 = fVar1 * auVar16._12_4_ + fVar43;
          fVar44 = fVar1 * auVar16._16_4_ + fVar44;
          fVar45 = fVar1 * auVar16._20_4_ + fVar45;
          fVar46 = fVar1 * auVar16._24_4_ + fVar46;
          fVar47 = fVar1 + fVar47;
          auVar49 = ZEXT3264(CONCAT428(fVar1 + auVar49._28_4_,
                                       CONCAT424(fVar2 * auVar16._24_4_ + auVar49._24_4_,
                                                 CONCAT420(fVar2 * auVar16._20_4_ + auVar49._20_4_,
                                                           CONCAT416(fVar2 * auVar16._16_4_ +
                                                                     auVar49._16_4_,
                                                                     CONCAT412(fVar2 * auVar16.
                                                  _12_4_ + auVar49._12_4_,
                                                  CONCAT48(fVar2 * auVar16._8_4_ + auVar49._8_4_,
                                                           CONCAT44(fVar2 * auVar16._4_4_ +
                                                                    auVar49._4_4_,
                                                                    fVar2 * auVar16._0_4_ +
                                                                    auVar49._0_4_))))))));
          lVar37 = lVar37 + 8;
        }
        *(float *)*pauVar18 = fVar40;
        *(float *)((long)*pauVar18 + 4) = fVar41;
        *(float *)((long)*pauVar18 + 8) = fVar42;
        *(float *)((long)*pauVar18 + 0xc) = fVar43;
        *(float *)((long)*pauVar18 + 0x10) = fVar44;
        *(float *)((long)*pauVar18 + 0x14) = fVar45;
        *(float *)((long)*pauVar18 + 0x18) = fVar46;
        *(float *)((long)*pauVar18 + 0x1c) = fVar47;
        pauVar18[1] = auVar49._0_32_;
        pauVar18 = pauVar18 + 2;
        uVar25 = (ulong)((uint)uVar25 + 2);
      }
      while( true ) {
        uVar23 = (uint)uVar25;
        uVar22 = (uVar25 & 0xffffffff) % 0xc;
        if ((int)_w <= (int)uVar23) break;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        lVar21 = 0;
        iVar26 = (int)uVar24;
        while (bVar39 = iVar26 != 0, iVar26 = iVar26 + -1, bVar39) {
          fVar1 = *(float *)((long)(_func_int ***)local_98._0_8_ +
                            lVar21 + ((ulong)(((uint)(uVar22 >> 2) & 1) +
                                              (uVar23 & 1) + (int)(uVar22 >> 3) +
                                              (int)((uVar25 & 0xffffffff) / 0xc) +
                                             (uint)(((uint)uVar22 >> 1 & 1) != 0)) * lVar36 + lVar35
                                     ) * local_98._16_8_);
          pfVar30 = (float *)((long)pvVar34 + lVar21 * 8);
          fVar40 = fVar1 * *pfVar30 + fVar40;
          fVar41 = fVar1 * pfVar30[1] + fVar41;
          fVar42 = fVar1 * pfVar30[2] + fVar42;
          fVar43 = fVar1 * pfVar30[3] + fVar43;
          fVar44 = fVar1 * pfVar30[4] + fVar44;
          fVar45 = fVar1 * pfVar30[5] + fVar45;
          fVar46 = fVar1 * pfVar30[6] + fVar46;
          fVar47 = fVar1 + fVar47;
          lVar21 = lVar21 + 4;
        }
        *(float *)*pauVar18 = fVar40;
        *(float *)((long)*pauVar18 + 4) = fVar41;
        *(float *)((long)*pauVar18 + 8) = fVar42;
        *(float *)((long)*pauVar18 + 0xc) = fVar43;
        *(float *)((long)*pauVar18 + 0x10) = fVar44;
        *(float *)((long)*pauVar18 + 0x14) = fVar45;
        *(float *)((long)*pauVar18 + 0x18) = fVar46;
        *(float *)((long)*pauVar18 + 0x1c) = fVar47;
        pauVar18 = pauVar18 + 1;
        uVar25 = (ulong)(uVar23 + 1);
      }
      pvVar34 = (void *)((long)pvVar34 + lVar33);
    }
    local_40 = uVar28;
    uVar31 = uVar28 + 1;
  }
  piVar4 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
        free((void *)local_98._0_8_);
      }
      else {
        (*(*(_func_int ***)local_98._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_winograd_dot_pack8_avx(Mat& bottom_blob_tm, int outch, const Mat& kernel_tm, Mat& top_blob_tm, const Option& opt)
{
    // Mat bottom_blob_tm(tiles, 16/36/64, inch, 32u, 4, opt.workspace_allocator);

    const int tiles = bottom_blob_tm.w;
    const int batch = bottom_blob_tm.h;
    const int inch = bottom_blob_tm.c;

    // permute
    Mat bottom_blob_tm2;
    if (tiles >= 12)
        bottom_blob_tm2.create(12 * inch, tiles / 12 + (tiles % 12) / 8 + (tiles % 12 % 8) / 4 + (tiles % 12 % 4) / 2 + tiles % 12 % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 8)
        bottom_blob_tm2.create(8 * inch, tiles / 8 + (tiles % 8) / 4 + (tiles % 4) / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 4)
        bottom_blob_tm2.create(4 * inch, tiles / 4 + (tiles % 4) / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else if (tiles >= 2)
        bottom_blob_tm2.create(2 * inch, tiles / 2 + tiles % 2, batch, 32u, 8, opt.workspace_allocator);
    else // if (tiles >= 1)
        bottom_blob_tm2.create(1 * inch, tiles, batch, 32u, 8, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int r = 0; r < batch; r++)
    {
        Mat tm2 = bottom_blob_tm2.channel(r);

        // tile
        int i = 0;

        for (; i + 11 < tiles; i += 12)
        {
            float* tmpptr = tm2.row(i / 12);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x12
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(r0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(r0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(r0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(r0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(r0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(r0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(r0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(r0 + 8 * 11);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                __m256 _tmp8 = _mm256_unpacklo_ps(_r8, _r9);
                __m256 _tmp9 = _mm256_unpackhi_ps(_r8, _r9);
                __m256 _tmpa = _mm256_unpacklo_ps(_ra, _rb);
                __m256 _tmpb = _mm256_unpackhi_ps(_ra, _rb);
                __m256 _tmpc = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpd = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpe = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpf = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpg = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmph = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpi = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpj = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpk = _mm256_shuffle_ps(_tmp8, _tmpa, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpl = _mm256_shuffle_ps(_tmp8, _tmpa, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpm = _mm256_shuffle_ps(_tmp9, _tmpb, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpn = _mm256_shuffle_ps(_tmp9, _tmpb, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmpc, _tmpg, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmpk, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmph, _tmpl, _MM_SHUFFLE(0, 2, 0, 0));
                _r3 = _mm256_permute2f128_ps(_tmpe, _tmpi, _MM_SHUFFLE(0, 2, 0, 0));
                _r4 = _mm256_permute2f128_ps(_tmpm, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                _r5 = _mm256_permute2f128_ps(_tmpj, _tmpn, _MM_SHUFFLE(0, 2, 0, 0));
                _r6 = _mm256_permute2f128_ps(_tmpc, _tmpg, _MM_SHUFFLE(0, 3, 0, 1));
                _r7 = _mm256_permute2f128_ps(_tmpk, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                _r8 = _mm256_permute2f128_ps(_tmph, _tmpl, _MM_SHUFFLE(0, 3, 0, 1));
                _r9 = _mm256_permute2f128_ps(_tmpe, _tmpi, _MM_SHUFFLE(0, 3, 0, 1));
                _ra = _mm256_permute2f128_ps(_tmpm, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));
                _rb = _mm256_permute2f128_ps(_tmpj, _tmpn, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);
                _mm256_store_ps(tmpptr + 8 * 4, _r4);
                _mm256_store_ps(tmpptr + 8 * 5, _r5);
                _mm256_store_ps(tmpptr + 8 * 6, _r6);
                _mm256_store_ps(tmpptr + 8 * 7, _r7);
                _mm256_store_ps(tmpptr + 8 * 8, _r8);
                _mm256_store_ps(tmpptr + 8 * 9, _r9);
                _mm256_store_ps(tmpptr + 8 * 10, _ra);
                _mm256_store_ps(tmpptr + 8 * 11, _rb);

                tmpptr += 96;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 7 < tiles; i += 8)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x8
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(r0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(r0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(r0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(r0 + 8 * 7);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_unpacklo_ps(_r4, _r5);
                __m256 _tmp5 = _mm256_unpackhi_ps(_r4, _r5);
                __m256 _tmp6 = _mm256_unpacklo_ps(_r6, _r7);
                __m256 _tmp7 = _mm256_unpackhi_ps(_r6, _r7);
                __m256 _tmp8 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp9 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpa = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpb = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpc = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpd = _mm256_shuffle_ps(_tmp4, _tmp6, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmpe = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmpf = _mm256_shuffle_ps(_tmp5, _tmp7, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 2, 0, 0));
                _r3 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 2, 0, 0));
                _r4 = _mm256_permute2f128_ps(_tmp8, _tmpc, _MM_SHUFFLE(0, 3, 0, 1));
                _r5 = _mm256_permute2f128_ps(_tmp9, _tmpd, _MM_SHUFFLE(0, 3, 0, 1));
                _r6 = _mm256_permute2f128_ps(_tmpa, _tmpe, _MM_SHUFFLE(0, 3, 0, 1));
                _r7 = _mm256_permute2f128_ps(_tmpb, _tmpf, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);
                _mm256_store_ps(tmpptr + 8 * 4, _r4);
                _mm256_store_ps(tmpptr + 8 * 5, _r5);
                _mm256_store_ps(tmpptr + 8 * 6, _r6);
                _mm256_store_ps(tmpptr + 8 * 7, _r7);

                tmpptr += 64;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 3 < tiles; i += 4)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x4
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);
                __m256 _r2 = _mm256_load_ps(r0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(r0 + 8 * 3);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                __m256 _tmp2 = _mm256_unpacklo_ps(_r2, _r3);
                __m256 _tmp3 = _mm256_unpackhi_ps(_r2, _r3);
                __m256 _tmp4 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp5 = _mm256_shuffle_ps(_tmp0, _tmp2, _MM_SHUFFLE(3, 2, 3, 2));
                __m256 _tmp6 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(1, 0, 1, 0));
                __m256 _tmp7 = _mm256_shuffle_ps(_tmp1, _tmp3, _MM_SHUFFLE(3, 2, 3, 2));
                _r0 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 2, 0, 0));
                _r2 = _mm256_permute2f128_ps(_tmp4, _tmp5, _MM_SHUFFLE(0, 3, 0, 1));
                _r3 = _mm256_permute2f128_ps(_tmp6, _tmp7, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);
                _mm256_store_ps(tmpptr + 8 * 2, _r2);
                _mm256_store_ps(tmpptr + 8 * 3, _r3);

                tmpptr += 32;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
        for (; i + 1 < tiles; i += 2)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);

            const float* r0 = bottom_blob_tm;

            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                // transpose 8x2
                __m256 _r0 = _mm256_load_ps(r0);
                __m256 _r1 = _mm256_load_ps(r0 + 8);

                __m256 _tmp0 = _mm256_unpacklo_ps(_r0, _r1);
                __m256 _tmp1 = _mm256_unpackhi_ps(_r0, _r1);
                _r0 = _mm256_permute2f128_ps(_tmp0, _tmp1, _MM_SHUFFLE(0, 2, 0, 0));
                _r1 = _mm256_permute2f128_ps(_tmp0, _tmp1, _MM_SHUFFLE(0, 3, 0, 1));

                _mm256_store_ps(tmpptr, _r0);
                _mm256_store_ps(tmpptr + 8, _r1);

                tmpptr += 16;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }

        for (; i < tiles; i++)
        {
            float* tmpptr = tm2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);

            const float* r0 = bottom_blob_tm;
            r0 += (r * tiles + i) * 8;

            for (int q = 0; q < inch; q++)
            {
                __m256 _val = _mm256_load_ps(r0);
                _mm256_store_ps(tmpptr, _val);

                tmpptr += 8;
                r0 += bottom_blob_tm.cstep * 8;
            }
        }
    }

    bottom_blob_tm = Mat();
    // permute end

    top_blob_tm.create(tiles, batch, outch, 32u, 8, opt.workspace_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* output0_tm = top_blob_tm.channel(p);

        const Mat kernel0_tm = kernel_tm.channel(p);

        for (int r = 0; r < batch; r++)
        {
            const Mat bb2 = bottom_blob_tm2.channel(r);

            int i = 0;
            for (; i + 11 < tiles; i += 12)
            {
                const float* r0 = bb2.row(i / 12);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();
                __m256 _sum4 = _mm256_setzero_ps();
                __m256 _sum5 = _mm256_setzero_ps();
                __m256 _sum6 = _mm256_setzero_ps();
                __m256 _sum7 = _mm256_setzero_ps();
                __m256 _sum8 = _mm256_setzero_ps();
                __m256 _sum9 = _mm256_setzero_ps();
                __m256 _suma = _mm256_setzero_ps();
                __m256 _sumb = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                    __m256 _val4 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _val5 = _mm256_broadcast_ss(r0 + 5);
                    _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                    __m256 _val6 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _val7 = _mm256_broadcast_ss(r0 + 7);
                    _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);
                    __m256 _val8 = _mm256_broadcast_ss(r0 + 8);
                    __m256 _val9 = _mm256_broadcast_ss(r0 + 9);
                    _sum8 = _mm256_comp_fmadd_ps(_val8, _w0, _sum8);
                    _sum9 = _mm256_comp_fmadd_ps(_val9, _w0, _sum9);
                    __m256 _vala = _mm256_broadcast_ss(r0 + 10);
                    __m256 _valb = _mm256_broadcast_ss(r0 + 11);
                    _suma = _mm256_comp_fmadd_ps(_vala, _w0, _suma);
                    _sumb = _mm256_comp_fmadd_ps(_valb, _w0, _sumb);

                    r0 += 12;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);
                _mm256_store_ps(output0_tm + 8 * 4, _sum4);
                _mm256_store_ps(output0_tm + 8 * 5, _sum5);
                _mm256_store_ps(output0_tm + 8 * 6, _sum6);
                _mm256_store_ps(output0_tm + 8 * 7, _sum7);
                _mm256_store_ps(output0_tm + 8 * 8, _sum8);
                _mm256_store_ps(output0_tm + 8 * 9, _sum9);
                _mm256_store_ps(output0_tm + 8 * 10, _suma);
                _mm256_store_ps(output0_tm + 8 * 11, _sumb);

                output0_tm += 8 * 12;
            }
            for (; i + 7 < tiles; i += 8)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();
                __m256 _sum4 = _mm256_setzero_ps();
                __m256 _sum5 = _mm256_setzero_ps();
                __m256 _sum6 = _mm256_setzero_ps();
                __m256 _sum7 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                    __m256 _val4 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _val5 = _mm256_broadcast_ss(r0 + 5);
                    _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                    _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                    __m256 _val6 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _val7 = _mm256_broadcast_ss(r0 + 7);
                    _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                    _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                    r0 += 8;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);
                _mm256_store_ps(output0_tm + 8 * 4, _sum4);
                _mm256_store_ps(output0_tm + 8 * 5, _sum5);
                _mm256_store_ps(output0_tm + 8 * 6, _sum6);
                _mm256_store_ps(output0_tm + 8 * 7, _sum7);

                output0_tm += 8 * 8;
            }
            for (; i + 3 < tiles; i += 4)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();
                __m256 _sum2 = _mm256_setzero_ps();
                __m256 _sum3 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                    __m256 _val2 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _val3 = _mm256_broadcast_ss(r0 + 3);
                    _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                    _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);

                    r0 += 4;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);
                _mm256_store_ps(output0_tm + 8 * 2, _sum2);
                _mm256_store_ps(output0_tm + 8 * 3, _sum3);

                output0_tm += 8 * 4;
            }
            for (; i + 1 < tiles; i += 2)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();
                __m256 _sum1 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);

                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    __m256 _val1 = _mm256_broadcast_ss(r0 + 1);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                    _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);

                    r0 += 2;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);
                _mm256_store_ps(output0_tm + 8, _sum1);

                output0_tm += 8 * 2;
            }

            for (; i < tiles; i++)
            {
                const float* r0 = bb2.row(i / 12 + (i % 12) / 8 + (i % 12 % 8) / 4 + (i % 12 % 4) / 2 + i % 12 % 2);
                const float* k0 = kernel0_tm.row(r);

                int nn = inch * 8; // inch always > 0

                __m256 _sum0 = _mm256_setzero_ps();

                for (int j = 0; j < nn; j++)
                {
                    __m256 _w0 = _mm256_load_ps(k0);
                    __m256 _val0 = _mm256_broadcast_ss(r0);
                    _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                    r0 += 1;
                    k0 += 8;
                }

                _mm256_store_ps(output0_tm, _sum0);

                output0_tm += 8;
            }
        }
    }
}